

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_context.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::Context::InitializeFieldGeneratorInfoForFields
          (Context *this,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *fields)

{
  _Bit_pointer *__return_storage_ptr__;
  bool bVar1;
  int iVar2;
  long *plVar3;
  LogMessage *pLVar4;
  pointer ppFVar5;
  mapped_type *pmVar6;
  long *plVar7;
  java *pjVar8;
  FieldDescriptor *extraout_RDX;
  pointer field_00;
  pointer extraout_RDX_00;
  pointer extraout_RDX_01;
  pointer extraout_RDX_02;
  pointer extraout_RDX_03;
  pointer extraout_RDX_04;
  pointer extraout_RDX_05;
  pointer extraout_RDX_06;
  pointer extraout_RDX_07;
  FieldDescriptor *extraout_RDX_08;
  FieldDescriptor *extraout_RDX_09;
  FieldDescriptor *extraout_RDX_10;
  FieldDescriptor *extraout_RDX_11;
  FieldDescriptor *extraout_RDX_12;
  FieldDescriptor *extraout_RDX_13;
  FieldDescriptor *pFVar9;
  FieldDescriptor *pFVar10;
  long lVar11;
  difference_type __n;
  ulong uVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  FieldDescriptor *local_1a8;
  undefined1 local_1a0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  conflict_reason;
  ulong local_178;
  long local_170;
  undefined1 local_160 [8];
  FieldGeneratorInfo info;
  long local_f0;
  long lStack_e8;
  undefined1 local_e0 [8];
  vector<bool,_std::allocator<bool>_> is_conflict;
  pointer local_b0;
  unsigned_long local_a8 [4];
  java *local_88;
  FieldDescriptor *field;
  long local_78;
  long lStack_70;
  java *local_68;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *local_60;
  FieldDescriptor *local_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  local_160 = (undefined1  [8])((ulong)local_160 & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_e0,
             (long)(fields->
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(fields->
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 3,(bool *)local_160,
             (allocator_type *)
             &is_conflict.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_1a0,
           (long)(fields->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(fields->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)local_160);
  ppFVar5 = (fields->
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pFVar9 = extraout_RDX;
  local_60 = fields;
  if ((fields->
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppFVar5) {
    local_178 = 1;
    local_170 = 0x20;
    pFVar9 = extraout_RDX;
    pFVar10 = (FieldDescriptor *)0x0;
    do {
      local_68 = (java *)ppFVar5[(long)pFVar10];
      UnderscoresToCapitalizedCamelCase_abi_cxx11_
                ((string *)
                 &is_conflict.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage,local_68,pFVar9);
      local_1a8 = pFVar10 + 1;
      ppFVar5 = (fields->
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      local_58 = pFVar10;
      if (local_1a8 <
          (FieldDescriptor *)
          ((long)(fields->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar5 >> 3)) {
        field_00 = (pointer)(1L << ((byte)pFVar10 & 0x3f));
        lVar11 = local_170;
        uVar12 = local_178;
        conflict_reason.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = field_00;
        do {
          pjVar8 = (java *)ppFVar5[uVar12];
          UnderscoresToCapitalizedCamelCase_abi_cxx11_
                    ((string *)local_160,pjVar8,(FieldDescriptor *)field_00);
          if (local_b0 == info.name._M_dataplus._M_p) {
            if (local_b0 != (pointer)0x0) {
              iVar2 = bcmp(is_conflict.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_end_of_storage,(void *)local_160,
                           (size_t)local_b0);
              if (iVar2 != 0) goto LAB_002027f2;
            }
            *(ulong *)((long)local_e0 + (uVar12 >> 6) * 8) =
                 *(ulong *)((long)local_e0 + (uVar12 >> 6) * 8) | 1L << ((byte)uVar12 & 0x3f);
            *(ulong *)((long)local_e0 + ((ulong)pFVar10 >> 6) * 8) =
                 *(ulong *)((long)local_e0 + ((ulong)pFVar10 >> 6) * 8) |
                 (ulong)conflict_reason.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
            std::operator+(&local_1c8,"capitalized name of field \"",
                           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            local_68);
            plVar3 = (long *)std::__cxx11::string::append((char *)&local_1c8);
            info.disambiguated_reason.field_2._8_8_ = &local_f0;
            plVar7 = plVar3 + 2;
            if ((long *)*plVar3 == plVar7) {
              local_f0 = *plVar7;
              lStack_e8 = plVar3[3];
            }
            else {
              local_f0 = *plVar7;
              info.disambiguated_reason.field_2._8_8_ = (long *)*plVar3;
            }
            *plVar3 = (long)plVar7;
            plVar3[1] = 0;
            *(undefined1 *)(plVar3 + 2) = 0;
            plVar3 = (long *)std::__cxx11::string::_M_append
                                       (info.disambiguated_reason.field_2._M_local_buf + 8,
                                        **(ulong **)pjVar8);
            fields = local_60;
            local_88 = (java *)&local_78;
            pjVar8 = (java *)(plVar3 + 2);
            if ((java *)*plVar3 == pjVar8) {
              local_78 = *(long *)pjVar8;
              lStack_70 = plVar3[3];
            }
            else {
              local_78 = *(long *)pjVar8;
              local_88 = (java *)*plVar3;
            }
            field = (FieldDescriptor *)plVar3[1];
            *plVar3 = (long)pjVar8;
            plVar3[1] = 0;
            *(undefined1 *)(plVar3 + 2) = 0;
            plVar3 = (long *)std::__cxx11::string::append((char *)&local_88);
            local_50 = &local_40;
            plVar7 = plVar3 + 2;
            if ((long *)*plVar3 == plVar7) {
              local_40 = *plVar7;
              lStack_38 = plVar3[3];
            }
            else {
              local_40 = *plVar7;
              local_50 = (long *)*plVar3;
            }
            local_48 = plVar3[1];
            *plVar3 = (long)plVar7;
            plVar3[1] = 0;
            *(undefined1 *)(plVar3 + 2) = 0;
            std::__cxx11::string::operator=
                      ((string *)((long)&((_Alloc_hider *)local_1a0)->_M_p + lVar11),
                       (string *)&local_50);
            std::__cxx11::string::_M_assign((string *)((long)local_1a0 + local_58 * 0x20));
            field_00 = extraout_RDX_02;
            if (local_50 != &local_40) {
              operator_delete(local_50);
              field_00 = extraout_RDX_03;
            }
            if (local_88 != (java *)&local_78) {
              operator_delete(local_88);
              field_00 = extraout_RDX_04;
            }
            if ((long *)info.disambiguated_reason.field_2._8_8_ != &local_f0) {
              operator_delete((void *)info.disambiguated_reason.field_2._8_8_);
              field_00 = extraout_RDX_05;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
              operator_delete(local_1c8._M_dataplus._M_p);
              field_00 = extraout_RDX_06;
            }
          }
          else {
LAB_002027f2:
            bVar1 = anon_unknown_7::IsConflicting
                              ((FieldDescriptor *)local_68,
                               (string *)
                               &is_conflict.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_end_of_storage,(FieldDescriptor *)pjVar8
                               ,(string *)local_160,
                               (string *)((long)&((_Alloc_hider *)local_1a0)->_M_p + lVar11));
            fields = local_60;
            field_00 = extraout_RDX_00;
            if (bVar1) {
              *(ulong *)((long)local_e0 + (uVar12 >> 6) * 8) =
                   *(ulong *)((long)local_e0 + (uVar12 >> 6) * 8) | 1L << ((byte)uVar12 & 0x3f);
              *(ulong *)((long)local_e0 + ((ulong)pFVar10 >> 6) * 8) =
                   *(ulong *)((long)local_e0 + ((ulong)pFVar10 >> 6) * 8) |
                   (ulong)conflict_reason.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
              std::__cxx11::string::_M_assign((string *)((long)local_1a0 + local_58 * 0x20));
              field_00 = extraout_RDX_01;
            }
          }
          if (local_160 != (undefined1  [8])&info.name._M_string_length) {
            operator_delete((void *)local_160);
            field_00 = extraout_RDX_07;
          }
          uVar12 = uVar12 + 1;
          ppFVar5 = (fields->
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          lVar11 = lVar11 + 0x20;
        } while (uVar12 < (ulong)((long)(fields->
                                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar5
                                 >> 3));
      }
      pFVar9 = local_58;
      if ((*(ulong *)((long)local_e0 + ((ulong)local_58 >> 6) * 8) >> ((ulong)local_58 & 0x3f) & 1)
          != 0) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_160,LOGLEVEL_WARNING,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/compiler/java/java_context.cc"
                   ,0x95);
        pLVar4 = (LogMessage *)
                 google::protobuf::internal::LogMessage::operator<<
                           ((LogMessage *)local_160,"field \"");
        pLVar4 = (LogMessage *)
                 google::protobuf::internal::LogMessage::operator<<
                           (pLVar4,*(string **)(local_68 + 8));
        pLVar4 = (LogMessage *)
                 google::protobuf::internal::LogMessage::operator<<(pLVar4,"\" is conflicting ");
        pLVar4 = (LogMessage *)
                 google::protobuf::internal::LogMessage::operator<<(pLVar4,"with another field: ");
        pLVar4 = (LogMessage *)
                 google::protobuf::internal::LogMessage::operator<<
                           (pLVar4,(string *)((long)local_1a0 + pFVar9 * 0x20));
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar4);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_160);
      }
      if (is_conflict.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_end_of_storage != local_a8) {
        operator_delete(is_conflict.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_end_of_storage);
      }
      ppFVar5 = (fields->
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      local_178 = local_178 + 1;
      local_170 = local_170 + 0x20;
      pFVar9 = local_1a8;
      pFVar10 = local_1a8;
    } while (local_1a8 <
             (FieldDescriptor *)
             ((long)(fields->
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar5 >> 3));
  }
  ppFVar5 = (fields->
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((fields->
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppFVar5) {
    __return_storage_ptr__ =
         &is_conflict.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_end_of_storage;
    uVar12 = 0;
    do {
      local_88 = (java *)ppFVar5[uVar12];
      local_160 = (undefined1  [8])&info.name._M_string_length;
      info.name._M_dataplus._M_p = (pointer)0x0;
      info.name._M_string_length._0_1_ = 0;
      info.name.field_2._8_8_ = &info.capitalized_name._M_string_length;
      info.capitalized_name._M_dataplus._M_p = (pointer)0x0;
      info.capitalized_name._M_string_length._0_1_ = 0;
      info.capitalized_name.field_2._8_8_ = &info.disambiguated_reason._M_string_length;
      info.disambiguated_reason._M_dataplus._M_p = (pointer)0x0;
      info.disambiguated_reason._M_string_length._0_1_ = 0;
      CamelCaseFieldName_abi_cxx11_((string *)__return_storage_ptr__,local_88,pFVar9);
      std::__cxx11::string::operator=((string *)local_160,(string *)__return_storage_ptr__);
      pFVar9 = extraout_RDX_08;
      if (is_conflict.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_end_of_storage != local_a8) {
        operator_delete(is_conflict.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_end_of_storage);
        pFVar9 = extraout_RDX_09;
      }
      UnderscoresToCapitalizedCamelCase_abi_cxx11_((string *)__return_storage_ptr__,local_88,pFVar9)
      ;
      std::__cxx11::string::operator=
                ((string *)(info.name.field_2._M_local_buf + 8),(string *)__return_storage_ptr__);
      if (is_conflict.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_end_of_storage != local_a8) {
        operator_delete(is_conflict.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_end_of_storage);
      }
      if ((*(ulong *)((long)local_e0 + (uVar12 >> 6) * 8) >> (uVar12 & 0x3f) & 1) != 0) {
        is_conflict.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = local_a8;
        lVar11 = google::protobuf::FastInt32ToBufferLeft(*(int *)(local_88 + 0x44),(char *)local_a8)
        ;
        local_50 = &local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,
                   is_conflict.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_end_of_storage,
                   (lVar11 - (long)local_a8) +
                   (long)is_conflict.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_end_of_storage);
        std::__cxx11::string::_M_append(local_160,(ulong)local_50);
        if (local_50 != &local_40) {
          operator_delete(local_50);
        }
        is_conflict.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = local_a8;
        lVar11 = google::protobuf::FastInt32ToBufferLeft(*(int *)(local_88 + 0x44),(char *)local_a8)
        ;
        local_50 = &local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,
                   is_conflict.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_end_of_storage,
                   (lVar11 - (long)local_a8) +
                   (long)is_conflict.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_end_of_storage);
        std::__cxx11::string::_M_append(info.name.field_2._M_local_buf + 8,(ulong)local_50);
        if (local_50 != &local_40) {
          operator_delete(local_50);
        }
        std::__cxx11::string::_M_assign((string *)(info.capitalized_name.field_2._M_local_buf + 8));
      }
      pmVar6 = std::
               map<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::FieldGeneratorInfo,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::compiler::java::FieldGeneratorInfo>_>_>
               ::operator[](&this->field_generator_info_map_,(key_type *)&local_88);
      std::__cxx11::string::_M_assign((string *)pmVar6);
      std::__cxx11::string::_M_assign((string *)&pmVar6->capitalized_name);
      std::__cxx11::string::_M_assign((string *)&pmVar6->disambiguated_reason);
      pFVar9 = extraout_RDX_10;
      if ((size_type *)info.capitalized_name.field_2._8_8_ !=
          &info.disambiguated_reason._M_string_length) {
        operator_delete((void *)info.capitalized_name.field_2._8_8_);
        pFVar9 = extraout_RDX_11;
      }
      if ((size_type *)info.name.field_2._8_8_ != &info.capitalized_name._M_string_length) {
        operator_delete((void *)info.name.field_2._8_8_);
        pFVar9 = extraout_RDX_12;
      }
      if (local_160 != (undefined1  [8])&info.name._M_string_length) {
        operator_delete((void *)local_160);
        pFVar9 = extraout_RDX_13;
      }
      uVar12 = uVar12 + 1;
      ppFVar5 = (local_60->
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar12 < (ulong)((long)(local_60->
                                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar5 >> 3
                             ));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1a0);
  if (local_e0 != (undefined1  [8])0x0) {
    operator_delete((void *)local_e0);
  }
  return;
}

Assistant:

void Context::InitializeFieldGeneratorInfoForFields(
    const std::vector<const FieldDescriptor*>& fields) {
  // Find out all fields that conflict with some other field in the same
  // message.
  std::vector<bool> is_conflict(fields.size());
  std::vector<std::string> conflict_reason(fields.size());
  for (int i = 0; i < fields.size(); ++i) {
    const FieldDescriptor* field = fields[i];
    const std::string& name = UnderscoresToCapitalizedCamelCase(field);
    for (int j = i + 1; j < fields.size(); ++j) {
      const FieldDescriptor* other = fields[j];
      const std::string& other_name = UnderscoresToCapitalizedCamelCase(other);
      if (name == other_name) {
        is_conflict[i] = is_conflict[j] = true;
        conflict_reason[i] = conflict_reason[j] =
            "capitalized name of field \"" + field->name() +
            "\" conflicts with field \"" + other->name() + "\"";
      } else if (IsConflicting(field, name, other, other_name,
                               &conflict_reason[j])) {
        is_conflict[i] = is_conflict[j] = true;
        conflict_reason[i] = conflict_reason[j];
      }
    }
    if (is_conflict[i]) {
      GOOGLE_LOG(WARNING) << "field \"" << field->full_name() << "\" is conflicting "
                   << "with another field: " << conflict_reason[i];
    }
  }
  for (int i = 0; i < fields.size(); ++i) {
    const FieldDescriptor* field = fields[i];
    FieldGeneratorInfo info;
    info.name = CamelCaseFieldName(field);
    info.capitalized_name = UnderscoresToCapitalizedCamelCase(field);
    // For fields conflicting with some other fields, we append the field
    // number to their field names in generated code to avoid conflicts.
    if (is_conflict[i]) {
      info.name += StrCat(field->number());
      info.capitalized_name += StrCat(field->number());
      info.disambiguated_reason = conflict_reason[i];
    }
    field_generator_info_map_[field] = info;
  }
}